

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

char * __thiscall
Assimp::FBX::FBXConverter::NameTransformationComp(FBXConverter *this,TransformationComp comp)

{
  TransformationComp comp_local;
  FBXConverter *this_local;
  
  switch(comp) {
  case TransformationComp_GeometricScalingInverse:
    this_local = (FBXConverter *)anon_var_dwarf_c2864a;
    break;
  case TransformationComp_GeometricRotationInverse:
    this_local = (FBXConverter *)anon_var_dwarf_c28661;
    break;
  case TransformationComp_GeometricTranslationInverse:
    this_local = (FBXConverter *)anon_var_dwarf_c28678;
    break;
  case TransformationComp_Translation:
    this_local = (FBXConverter *)0xab605e;
    break;
  case TransformationComp_RotationOffset:
    this_local = (FBXConverter *)anon_var_dwarf_c28567;
    break;
  case TransformationComp_RotationPivot:
    this_local = (FBXConverter *)anon_var_dwarf_c2857e;
    break;
  case TransformationComp_PreRotation:
    this_local = (FBXConverter *)anon_var_dwarf_c28595;
    break;
  case TransformationComp_Rotation:
    this_local = (FBXConverter *)0xab606e;
    break;
  case TransformationComp_PostRotation:
    this_local = (FBXConverter *)anon_var_dwarf_c285ab;
    break;
  case TransformationComp_RotationPivotInverse:
    this_local = (FBXConverter *)0xab6e3f;
    break;
  case TransformationComp_ScalingOffset:
    this_local = (FBXConverter *)anon_var_dwarf_c285d9;
    break;
  case TransformationComp_ScalingPivot:
    this_local = (FBXConverter *)anon_var_dwarf_c285e4;
    break;
  case TransformationComp_Scaling:
    this_local = (FBXConverter *)0xab607b;
    break;
  case TransformationComp_ScalingPivotInverse:
    this_local = (FBXConverter *)0xab6e6f;
    break;
  case TransformationComp_GeometricTranslation:
    this_local = (FBXConverter *)anon_var_dwarf_c2863f;
    break;
  case TransformationComp_GeometricRotation:
    this_local = (FBXConverter *)anon_var_dwarf_c28628;
    break;
  case TransformationComp_GeometricScaling:
    this_local = (FBXConverter *)anon_var_dwarf_c28611;
    break;
  case TransformationComp_MAXIMUM:
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x1ec,
                  "const char *Assimp::FBX::FBXConverter::NameTransformationComp(TransformationComp)"
                 );
  }
  return (char *)this_local;
}

Assistant:

const char* FBXConverter::NameTransformationComp(TransformationComp comp) {
            switch (comp) {
            case TransformationComp_Translation:
                return "Translation";
            case TransformationComp_RotationOffset:
                return "RotationOffset";
            case TransformationComp_RotationPivot:
                return "RotationPivot";
            case TransformationComp_PreRotation:
                return "PreRotation";
            case TransformationComp_Rotation:
                return "Rotation";
            case TransformationComp_PostRotation:
                return "PostRotation";
            case TransformationComp_RotationPivotInverse:
                return "RotationPivotInverse";
            case TransformationComp_ScalingOffset:
                return "ScalingOffset";
            case TransformationComp_ScalingPivot:
                return "ScalingPivot";
            case TransformationComp_Scaling:
                return "Scaling";
            case TransformationComp_ScalingPivotInverse:
                return "ScalingPivotInverse";
            case TransformationComp_GeometricScaling:
                return "GeometricScaling";
            case TransformationComp_GeometricRotation:
                return "GeometricRotation";
            case TransformationComp_GeometricTranslation:
                return "GeometricTranslation";
            case TransformationComp_GeometricScalingInverse:
                return "GeometricScalingInverse";
            case TransformationComp_GeometricRotationInverse:
                return "GeometricRotationInverse";
            case TransformationComp_GeometricTranslationInverse:
                return "GeometricTranslationInverse";
            case TransformationComp_MAXIMUM: // this is to silence compiler warnings
            default:
                break;
            }

            ai_assert(false);

            return nullptr;
        }